

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

void __thiscall Nova::Timer::Start(Timer *this,int id)

{
  Data *pDVar1;
  double dVar2;
  int id_local;
  Timer *this_local;
  
  dVar2 = Get_Current_Time();
  pDVar1 = Array<Nova::Timer::Data>::operator()(&this->timers,id);
  pDVar1->start = dVar2;
  return;
}

Assistant:

void Start(const int id)
    {timers(id).start=Get_Current_Time();}